

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdCelsiusRcFactor::emulate_mthd(MthdCelsiusRcFactor *this)

{
  MthdCelsiusRcFactor *this_local;
  
  pgraph_celsius_pre_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource <<
                 0x3e)) {
    if (*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 == 0) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_factor_0[0] =
           (this->super_SingleMthdTest).super_MthdTest.val;
    }
    else {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_factor_1[0] =
           (this->super_SingleMthdTest).super_MthdTest.val;
    }
    pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,
                        *(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 + 0x14,
                        (this->super_SingleMthdTest).super_MthdTest.val,true);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		if (!extr(exp.nsource, 1, 1)) {
			if (idx == 0)
				exp.bundle_rc_factor_0[0] = val;
			else
				exp.bundle_rc_factor_1[0] = val;
			pgraph_celsius_icmd(&exp, 0x14 + idx, val, true);
		}
	}